

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

BtorSimBitVector * btorsim_bv_redand(BtorSimBitVector *bv)

{
  uint32_t *puVar1;
  uint uVar2;
  BtorSimBitVector *pBVar3;
  uint uVar4;
  long lVar5;
  
  pBVar3 = btorsim_bv_new(1);
  uVar2 = bv->len;
  uVar4 = 0xffffffff;
  if ((ulong)uVar2 << 5 != (ulong)bv->width) {
    uVar4 = 0x7fffffff >> (~(byte)bv->width & 0x1f);
  }
  if (bv[1].width == uVar4) {
    lVar5 = 0;
    do {
      if ((ulong)(uVar2 + (uVar2 == 0)) - 1 == lVar5) {
        (&pBVar3[1].width)[pBVar3->len - 1] = (&pBVar3[1].width)[pBVar3->len - 1] | 1;
        return pBVar3;
      }
      puVar1 = &bv[1].len + lVar5;
      lVar5 = lVar5 + 1;
    } while (*puVar1 == 0xffffffff);
  }
  (&pBVar3[1].width)[pBVar3->len - 1] = (&pBVar3[1].width)[pBVar3->len - 1] & 0xfffffffe;
  return pBVar3;
}

Assistant:

BtorSimBitVector *
btorsim_bv_redand (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i;
  uint32_t bit;
  uint32_t mask0;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  assert (rem_bits_zero_dbg (res));

  if (bv->width == BTORSIM_BV_TYPE_BW * bv->len)
    mask0 = ~(BTORSIM_BV_TYPE) 0;
  else
    mask0 = BTOR2_MASK_REM_BITS (bv);

  bit = (bv->bits[0] == mask0);

  for (i = 1; bit && i < bv->len; i++)
    if (bv->bits[i] != ~(BTORSIM_BV_TYPE) 0) bit = 0;

  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}